

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_record_book_save_on_use.hpp
# Opt level: O0

uint32_t __thiscall
PatchRecordBookSaveOnUse::inject_use_record_book_function(PatchRecordBookSaveOnUse *this,ROM *rom)

{
  initializer_list<md::DataRegister> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<md::DataRegister> __l_01;
  size_t this_00;
  uint32_t uVar1;
  allocator<char> local_2a9;
  string local_2a8;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_288;
  allocator<md::DataRegister> local_261;
  DataRegister local_260;
  DataRegister local_250;
  iterator local_240;
  size_type local_238;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_230;
  Param local_218 [2];
  DataRegister local_208;
  Param local_1f8 [2];
  DataRegister local_1e8;
  allocator<unsigned_char> local_1d3;
  uchar local_1d2 [2];
  iterator local_1d0;
  size_type local_1c8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1c0;
  Param local_1a8 [2];
  Param local_198 [2];
  Param local_188 [2];
  Param local_178 [2];
  DataRegister local_168;
  Param local_158 [2];
  DataRegister local_148;
  Param local_138 [2];
  Param local_128 [2];
  DataRegister local_118;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_108;
  allocator<md::DataRegister> local_e5 [13];
  DataRegister local_d8;
  DataRegister local_c8;
  iterator local_b8;
  size_type local_b0;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_a8;
  undefined1 local_90 [8];
  Code func_use_record_book;
  ROM *rom_local;
  PatchRecordBookSaveOnUse *this_local;
  
  func_use_record_book._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)rom;
  md::Code::Code((Code *)local_90);
  md::DataRegister::DataRegister(&local_d8,'\0');
  md::DataRegister::DataRegister(&local_c8,'\x01');
  local_b8 = &local_d8;
  local_b0 = 2;
  std::allocator<md::DataRegister>::allocator(local_e5);
  __l_01._M_len = local_b0;
  __l_01._M_array = local_b8;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_a8,__l_01,local_e5);
  local_108.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector(&local_108);
  md::Code::movem_to_stack((Code *)local_90,&local_a8,&local_108);
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~vector(&local_108);
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::~vector(&local_a8);
  std::allocator<md::DataRegister>::~allocator(local_e5);
  if ((this->_consumable_record_book & 1U) != 0) {
    md::DataRegister::DataRegister(&local_118,'\0');
    addr_<void>((uint32_t)local_128,0xff1152);
    md::Code::moveb((Code *)local_90,(Param *)&local_118,local_128);
    md::Code::jsr((Code *)local_90,0x8b98);
  }
  addr_<void>((uint32_t)local_138,0xff1204);
  md::DataRegister::DataRegister(&local_148,'\0');
  md::Code::movew((Code *)local_90,local_138,(Param *)&local_148);
  addr_<void>((uint32_t)local_158,0xff5400);
  md::DataRegister::DataRegister(&local_168,'\x01');
  md::Code::movew((Code *)local_90,local_158,(Param *)&local_168);
  addr_<void>((uint32_t)local_178,0xff0018);
  addr_<void>((uint32_t)local_188,0xff1204);
  md::Code::movew((Code *)local_90,local_178,local_188);
  addr_<void>((uint32_t)local_198,0xff001a);
  addr_<void>((uint32_t)local_1a8,0xff5400);
  md::Code::movew((Code *)local_90,local_198,local_1a8);
  local_1d2[0] = '\0';
  local_1d2[1] = 7;
  local_1d0 = local_1d2;
  local_1c8 = 2;
  std::allocator<unsigned_char>::allocator(&local_1d3);
  __l_00._M_len = local_1c8;
  __l_00._M_array = local_1d0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_1c0,__l_00,&local_1d3);
  md::Code::trap((Code *)local_90,'\0',&local_1c0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_1c0);
  std::allocator<unsigned_char>::~allocator(&local_1d3);
  md::Code::jsr((Code *)local_90,0x29046);
  md::Code::add_word((Code *)local_90,0);
  md::Code::jsr((Code *)local_90,0x852);
  md::Code::jsr((Code *)local_90,0x1592);
  md::DataRegister::DataRegister(&local_1e8,'\0');
  addr_<void>((uint32_t)local_1f8,0xff1204);
  md::Code::movew((Code *)local_90,(Param *)&local_1e8,local_1f8);
  md::DataRegister::DataRegister(&local_208,'\x01');
  addr_<void>((uint32_t)local_218,0xff5400);
  md::Code::movew((Code *)local_90,(Param *)&local_208,local_218);
  md::DataRegister::DataRegister(&local_260,'\0');
  md::DataRegister::DataRegister(&local_250,'\x01');
  local_240 = &local_260;
  local_238 = 2;
  std::allocator<md::DataRegister>::allocator(&local_261);
  __l._M_len = local_238;
  __l._M_array = local_240;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_230,__l,&local_261);
  local_288.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_288.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector(&local_288);
  md::Code::movem_from_stack((Code *)local_90,&local_230,&local_288);
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~vector(&local_288);
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::~vector(&local_230);
  std::allocator<md::DataRegister>::~allocator(&local_261);
  md::Code::jmp((Code *)local_90,0x8bba);
  this_00 = func_use_record_book._labels._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"",&local_2a9);
  uVar1 = md::ROM::inject_code((ROM *)this_00,(Code *)local_90,&local_2a8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  md::Code::~Code((Code *)local_90);
  return uVar1;
}

Assistant:

uint32_t inject_use_record_book_function(md::ROM& rom) const
    {
        // -------- Function to save game using record book --------
        // On record book use, set stored position and map as current to fool the save_game function, then call it
        // to save the game with this map and position. Then, restore Nigel's position and map as if nothing happened.

        md::Code func_use_record_book;
        func_use_record_book.movem_to_stack({ reg_D0, reg_D1 }, {});

        if(_consumable_record_book)
        {
            func_use_record_book.moveb(reg_D0, addr_(0xFF1152));
            func_use_record_book.jsr(0x8B98); // ConsumeItem
        }

        func_use_record_book.movew(addr_(0xFF1204), reg_D0);
        func_use_record_book.movew(addr_(0xFF5400), reg_D1);

        func_use_record_book.movew(addr_(MAP_ENTRANCE_POSITION_ADDRESS), addr_(0xFF1204));
        func_use_record_book.movew(addr_(MAP_ENTRANCE_POSITION_ADDRESS+2), addr_(0xFF5400));

        func_use_record_book.trap(0, { 0x00, 0x07 }); // Play save game music
        func_use_record_book.jsr(0x29046); // Sleep_0 for 0x17 frames
        func_use_record_book.add_word(0x0000);
        func_use_record_book.jsr(0x852); // Restore BGM

        func_use_record_book.jsr(0x1592); // Save game to SRAM

        func_use_record_book.movew(reg_D0, addr_(0xFF1204));
        func_use_record_book.movew(reg_D1, addr_(0xFF5400));
        func_use_record_book.movem_from_stack({ reg_D0, reg_D1 }, {});

        func_use_record_book.jmp(offsets::PROC_ITEM_USE_RETURN_SUCCESS);

        return rom.inject_code(func_use_record_book);
    }